

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O1

void __thiscall IVmBifTadsRNG::put_state(IVmBifTadsRNG *this,vm_val_t *val)

{
  CVmObjPageEntry *pCVar1;
  long lVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  uchar *buf;
  ulong uVar6;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  uint local_110 [2];
  long local_108;
  void *local_100;
  __jmp_buf_tag local_f8;
  ulong len;
  
  iVar4 = (*this->_vptr_IVmBifTadsRNG[6])();
  len = CONCAT44(extraout_var,iVar4);
  if (len == 0) {
    if (val->typ == VM_INT) {
      uVar5 = (val->val).obj;
    }
    else {
      uVar5 = vm_val_t::nonint_num_to_int(val);
    }
    (*this->_vptr_IVmBifTadsRNG[8])(this,(ulong)uVar5);
  }
  else {
    (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                           [(ulong)(val->val).obj & 0xfff].ptr_ + 8))
              (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((ulong)(val->val).obj & 0xfff),
               CVmObjByteArray::metaclass_reg_);
    pCVar1 = G_obj_table_X.pages_[(val->val).obj >> 0xc];
    uVar6 = (ulong)(val->val).obj & 0xfff;
    if (len != **(uint **)((long)&pCVar1[uVar6].ptr_ + 8)) {
      err_throw(0x902);
    }
    buf = (uchar *)operator_new__(len);
    G_err_frame::__tls_init();
    local_108 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_110;
    local_110[0] = _setjmp(&local_f8);
    if (local_110[0] == 0) {
      CVmObjByteArray::copy_to_buf((CVmObjByteArray *)(pCVar1 + uVar6),buf,1,len);
      (*this->_vptr_IVmBifTadsRNG[10])(this,buf);
    }
    if (-1 < (short)local_110[0]) {
      local_110[0] = local_110[0] | 0x8000;
      operator_delete__(buf);
    }
    lVar2 = local_108;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar2;
    if ((local_110[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar3 = local_100;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar3;
      err_rethrow();
    }
    if ((local_110[0] & 2) != 0) {
      free(local_100);
    }
  }
  return;
}

Assistant:

void put_state(VMG_ vm_val_t *val)
    {
        /* determine what to do based on the state length */
        size_t len = get_state_size();
        if (len == 0)
        {
            /* simple int32_t state */
            put_state_int(val->num_to_int(vmg0_));
        }
        else
        {
            /* retrieve the ByteArray object */
            CVmObjByteArray *barr = vm_val_cast(CVmObjByteArray, val);

            /* check that it matches the expected state buffer size */
            unsigned long cnt = barr->get_element_count();
            if (cnt != len)
                err_throw(VMERR_BAD_VAL_BIF);

            /* retrieve the bytes and restore the state */
            char *buf = new char[len];
            err_try
            {
                /* retrieve the bytes */
                barr->copy_to_buf((unsigned char *)buf, 1, len);

                /* restore the state */
                put_state_buf(buf);
            }
            err_finally
            {
                delete [] buf;
            }